

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O0

bool crnlib::image_utils::read_from_stream_stb(data_stream_serializer *serializer,image_u8 *img)

{
  int new_width;
  undefined8 this;
  bool bVar1;
  uint uVar2;
  uchar *buffer;
  bool local_a9;
  color_quad<unsigned_char,_int> local_84;
  color_quad<unsigned_char,_int> *pcStack_80;
  color_quad_u8 c;
  color_quad_u8 *pDst_end;
  color_quad_u8 *pDst;
  color_quad_u8 *pSrc;
  int py;
  bool grayscale;
  stbi_uc *psStack_58;
  bool has_alpha;
  uchar *pData;
  uint local_48;
  int n;
  int y;
  int x;
  undefined1 local_30 [8];
  uint8_vec buf;
  image_u8 *img_local;
  data_stream_serializer *serializer_local;
  
  buf._8_8_ = img;
  vector<unsigned_char>::vector((vector<unsigned_char> *)local_30);
  bVar1 = data_stream_serializer::read_entire_file(serializer,(vector<unsigned_char> *)local_30);
  if (bVar1) {
    n = 0;
    local_48 = 0;
    pData._4_4_ = 0;
    buffer = vector<unsigned_char>::get_ptr((vector<unsigned_char> *)local_30);
    uVar2 = vector<unsigned_char>::size_in_bytes((vector<unsigned_char> *)local_30);
    psStack_58 = stbi_load_from_memory(buffer,uVar2,&n,(int *)&local_48,(int *)((long)&pData + 4),4)
    ;
    this = buf._8_8_;
    new_width = n;
    uVar2 = local_48;
    if (psStack_58 == (stbi_uc *)0x0) {
      serializer_local._7_1_ = false;
    }
    else if ((n < 0x4001) && ((int)local_48 < 0x4001)) {
      local_a9 = pData._4_4_ == 2 || pData._4_4_ == 4;
      grayscale = local_a9;
      color_quad<unsigned_char,_int>::make_black();
      image<crnlib::color_quad<unsigned_char,_int>_>::resize
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)this,new_width,uVar2,0xffffffff,
                 (color_quad<unsigned_char,_int> *)&py);
      pSrc._7_1_ = true;
      for (pSrc._0_4_ = 0; (int)(uint)pSrc < (int)local_48; pSrc._0_4_ = (uint)pSrc + 1) {
        pDst = (color_quad_u8 *)(psStack_58 + (long)(int)((uint)pSrc * n) * 4);
        pDst_end = image<crnlib::color_quad<unsigned_char,_int>_>::get_scanline
                             ((image<crnlib::color_quad<unsigned_char,_int>_> *)buf._8_8_,(uint)pSrc
                             );
        pcStack_80 = pDst_end + n;
        while (pDst_end != pcStack_80) {
          color_quad<unsigned_char,_int>::color_quad(&local_84,pDst);
          if ((grayscale & 1U) == 0) {
            local_84.field_0.field_0.a = 0xff;
          }
          bVar1 = color_quad<unsigned_char,_int>::is_grayscale(&local_84);
          if (!bVar1) {
            pSrc._7_1_ = false;
          }
          color_quad<unsigned_char,_int>::operator=(pDst_end,&local_84);
          pDst_end = pDst_end + 1;
          pDst = pDst + 1;
        }
      }
      stbi_image_free(psStack_58);
      image<crnlib::color_quad<unsigned_char,_int>_>::reset_comp_flags
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)buf._8_8_);
      image<crnlib::color_quad<unsigned_char,_int>_>::set_grayscale
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)buf._8_8_,pSrc._7_1_);
      image<crnlib::color_quad<unsigned_char,_int>_>::set_component_valid
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)buf._8_8_,3,(bool)(grayscale & 1)
                );
      serializer_local._7_1_ = true;
    }
    else {
      stbi_image_free(psStack_58);
      serializer_local._7_1_ = false;
    }
  }
  else {
    serializer_local._7_1_ = false;
  }
  y = 1;
  vector<unsigned_char>::~vector((vector<unsigned_char> *)local_30);
  return serializer_local._7_1_;
}

Assistant:

bool read_from_stream_stb(data_stream_serializer& serializer, image_u8& img)
        {
            uint8_vec buf;
            if (!serializer.read_entire_file(buf))
            {
                return false;
            }

            int x = 0, y = 0, n = 0;
            unsigned char* pData = stbi_load_from_memory(buf.get_ptr(), buf.size_in_bytes(), &x, &y, &n, 4);

            if (!pData)
            {
                return false;
            }

            if ((x > (int)CRNLIB_LARGEST_SUPPORTED_IMAGE_DIMENSION) || (y > (int)CRNLIB_LARGEST_SUPPORTED_IMAGE_DIMENSION))
            {
                stbi_image_free(pData);
                return false;
            }

            const bool has_alpha = ((n == 2) || (n == 4));

            img.resize(x, y);

            bool grayscale = true;

            for (int py = 0; py < y; py++)
            {
                const color_quad_u8* pSrc = reinterpret_cast<const color_quad_u8*>(pData) + (py * x);
                color_quad_u8* pDst = img.get_scanline(py);
                color_quad_u8* pDst_end = pDst + x;

                while (pDst != pDst_end)
                {
                    color_quad_u8 c(*pSrc++);
                    if (!has_alpha)
                    {
                        c.a = 255;
                    }

                    if (!c.is_grayscale())
                    {
                        grayscale = false;
                    }

                    *pDst++ = c;
                }
            }

            stbi_image_free(pData);

            img.reset_comp_flags();
            img.set_grayscale(grayscale);
            img.set_component_valid(3, has_alpha);

            return true;
        }